

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_128b966::LevelTest_TestTargetLevelRecode_Test::TestBody
          (LevelTest_TestTargetLevelRecode_Test *this)

{
  bool bVar1;
  EncoderTest *pEVar2;
  AssertHelper local_90;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  if ((this->super_LevelTest).cpu_used_ != 4) {
    return;
  }
  if (*(int *)&(this->super_LevelTest).super_EncoderTest.field_0x3dc != 2) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"rand_noise_w1280h720.yuv",
             (allocator *)&local_90);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x500,0x2d0,0x19,1,0,10);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (this->super_LevelTest).target_level_ = 5;
  (this->super_LevelTest).super_EncoderTest.cfg_.rc_target_bitrate = 5000;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pEVar2 = &(this->super_LevelTest).super_EncoderTest;
      (*pEVar2->_vptr_EncoderTest[2])(pEVar2,&video);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (gtest_fatal_failure_checker.has_new_fatal_failure_ == false) goto LAB_005e1776;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/level_test.cc"
             ,0xb4,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_005e1776:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevelRecode) {
  if (cpu_used_ == 4 && encoding_mode_ == ::libaom_test::kTwoPassGood) {
    libaom_test::I420VideoSource video("rand_noise_w1280h720.yuv", 1280, 720,
                                       25, 1, 0, 10);
    const int target_level = 0005;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 5000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }
}